

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void __thiscall TestRunner::TestRunner(TestRunner *this,char *ts_name)

{
  char *__filename;
  FILE *pFVar1;
  FILE *log_file;
  size_type i;
  allocator<char> local_39;
  string local_38 [8];
  string filename;
  char *ts_name_local;
  TestRunner *this_local;
  
  filename.field_2._8_8_ = ts_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,ts_name,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::rfind((char *)local_38,0x10b093);
  std::__cxx11::string::erase((ulong)local_38,0);
  std::__cxx11::string::operator+=(local_38,".log");
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"w+");
  logging_set_file(pFVar1);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

TestRunner( const char *ts_name )
	{
		std::string filename( ts_name );
		std::string::size_type i = filename.rfind( "/" );
		filename.erase( 0, i + 1 );
		filename += ".log";	
		//printf( "logging to file %s\n", filename.c_str() );
		FILE *log_file = fopen( filename.c_str(), "w+" );
		logging_set_file( log_file );
	}